

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O1

void __thiscall
cfd::js::api::json::VerifyEcdsaAdaptorRequest::ConvertFromStruct
          (VerifyEcdsaAdaptorRequest *this,VerifyEcdsaAdaptorRequestStruct *data)

{
  std::__cxx11::string::_M_assign((string *)&this->adaptor_signature_);
  std::__cxx11::string::_M_assign((string *)&this->proof_);
  std::__cxx11::string::_M_assign((string *)&this->adaptor_);
  std::__cxx11::string::_M_assign((string *)&this->message_);
  this->is_hashed_ = data->is_hashed;
  std::__cxx11::string::_M_assign((string *)&this->pubkey_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void VerifyEcdsaAdaptorRequest::ConvertFromStruct(
    const VerifyEcdsaAdaptorRequestStruct& data) {
  adaptor_signature_ = data.adaptor_signature;
  proof_ = data.proof;
  adaptor_ = data.adaptor;
  message_ = data.message;
  is_hashed_ = data.is_hashed;
  pubkey_ = data.pubkey;
  ignore_items = data.ignore_items;
}